

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O0

dict_undo_rec * __thiscall
CVmObjDict::alloc_undo_rec(CVmObjDict *this,dict_undo_action action,char *txt,size_t len)

{
  dict_undo_rec *pdVar1;
  size_t in_RCX;
  void *in_RDX;
  dict_undo_action in_ESI;
  dict_undo_rec *rec;
  size_t alloc_size;
  size_t local_28;
  
  local_28 = 0x1f;
  if (in_RDX != (void *)0x0) {
    local_28 = in_RCX + 0x1f;
  }
  pdVar1 = (dict_undo_rec *)malloc(local_28);
  pdVar1->action = in_ESI;
  if (in_RDX != (void *)0x0) {
    memcpy(pdVar1->txt,in_RDX,in_RCX);
  }
  pdVar1->len = in_RCX;
  pdVar1->obj = 0;
  pdVar1->prop = 0;
  return pdVar1;
}

Assistant:

dict_undo_rec *CVmObjDict::alloc_undo_rec(dict_undo_action action,
                                          const char *txt, size_t len)
{
    size_t alloc_size;
    dict_undo_rec *rec;
    
    /* 
     *   compute the allocation size - start with the structure size, and
     *   add in the length we need to store the string if one is present 
     */
    alloc_size = sizeof(dict_undo_rec) - 1;
    if (txt != 0)
        alloc_size += len;

    /* allocate the record */
    rec = (dict_undo_rec *)t3malloc(alloc_size);

    /* set the action */
    rec->action = action;

    /* if there's a word, copy the text */
    if (txt != 0)
        memcpy(rec->txt, txt, len);

    /* save the word length */
    rec->len = len;

    /* presume we won't store an object or property */
    rec->obj = VM_INVALID_OBJ;
    rec->prop = VM_INVALID_PROP;

    /* return the new record */
    return rec;
}